

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

int __thiscall
gl4cts::ShaderSubroutine::FunctionalTest5::verify
          (FunctionalTest5 *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen
          )

{
  bool bVar1;
  vec4<float> *in_stack_00000008;
  vec4<float> *in_stack_00000010;
  int *in_stack_00000018;
  
  bVar1 = Utils::vec4<float>::operator==((vec4<float> *)ctx,(vec4<float> *)tbslen);
  if ((((bVar1) &&
       (bVar1 = Utils::vec4<float>::operator==((vec4<float> *)sig,in_stack_00000008), bVar1)) &&
      (bVar1 = Utils::vec4<float>::operator==((vec4<float> *)siglen,in_stack_00000010), bVar1)) &&
     (((*(int *)tbs == *in_stack_00000018 && (*(int *)(tbs + 4) == in_stack_00000018[1])) &&
      (*(int *)(tbs + 8) == in_stack_00000018[2])))) {
    return (int)CONCAT71((int7)((ulong)in_stack_00000018 >> 8),
                         *(int *)(tbs + 0xc) == in_stack_00000018[3]);
  }
  return 0;
}

Assistant:

bool FunctionalTest5::verify(const Utils::vec4<glw::GLfloat>& first_routine_result,
							 const Utils::vec4<glw::GLfloat>& second_routine_result,
							 const Utils::vec4<glw::GLfloat>& third_routine_result,
							 const Utils::vec4<glw::GLuint>&  fourth_routine_result,
							 const Utils::vec4<glw::GLfloat>& first_routine_expected_result,
							 const Utils::vec4<glw::GLfloat>& second_routine_expected_result,
							 const Utils::vec4<glw::GLfloat>& third_routine_expected_result,
							 const Utils::vec4<glw::GLuint>&  fourth_routine_expected_result) const
{
	bool result = true;

	result = result && (first_routine_result == first_routine_expected_result);
	result = result && (second_routine_result == second_routine_expected_result);
	result = result && (third_routine_result == third_routine_expected_result);
	result = result && (fourth_routine_result == fourth_routine_expected_result);

	return result;
}